

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HVector *ep,int iRow,int *hint)

{
  pointer piVar1;
  pointer pdVar2;
  HVector *pHVar3;
  HFactor *pHVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int index;
  double value;
  int local_60;
  int local_5c;
  double local_58;
  int *local_50;
  HVector *local_48;
  HFactor *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar1 = (aq->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (aq->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = &this->PFindex;
  uVar8 = 0;
  uVar7 = (ulong)(uint)aq->packCount;
  local_5c = iRow;
  local_50 = hint;
  local_48 = aq;
  local_40 = this;
  if (aq->packCount < 1) {
    uVar7 = uVar8;
  }
  for (; pHVar4 = local_40, uVar7 != uVar8; uVar8 = uVar8 + 1) {
    local_60 = piVar1[uVar8];
    local_58 = pdVar2[uVar8];
    if (local_60 != iRow) {
      std::vector<int,_std::allocator<int>_>::push_back(local_38,&local_60);
      std::vector<double,_std::allocator<double>_>::push_back(&this->PFvalue,&local_58);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back(&local_40->PFpivotIndex,&local_5c);
  pHVar3 = local_48;
  std::vector<double,_std::allocator<double>_>::push_back
            (&pHVar4->PFpivotValue,
             (local_48->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + local_5c);
  local_58 = (double)CONCAT44(local_58._4_4_,
                              (int)((ulong)((long)(pHVar4->PFindex).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pHVar4->PFindex).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&pHVar4->PFstart,(int *)&local_58);
  iVar5 = pHVar3->packCount;
  iVar6 = pHVar4->UtotalX + iVar5;
  pHVar4->UtotalX = iVar6;
  if (pHVar4->UmeritX < iVar6) {
    *local_50 = 1;
    iVar5 = pHVar3->packCount;
  }
  pHVar4->FtotalX = pHVar4->FtotalX + iVar5;
  return;
}

Assistant:

void HFactor::updatePF(HVector *aq, HVector *ep, int iRow, int *hint) {
    // Check space
    const int columnCount = aq->packCount;
    const int *columnIndex = &aq->packIndex[0];
    const double *columnArray = &aq->packValue[0];

    // Copy the pivotal column
    for (int i = 0; i < columnCount; i++) {
        int index = columnIndex[i];
        double value = columnArray[i];
        if (index != iRow) {
            PFindex.push_back(index);
            PFvalue.push_back(value);
        }
    }

    // Save pivot
    PFpivotIndex.push_back(iRow);
    PFpivotValue.push_back(aq->array[iRow]);
    PFstart.push_back(PFindex.size());

    // Check refactor
    UtotalX += aq->packCount;
    if (UtotalX > UmeritX)
        *hint = 1;
    FtotalX += aq->packCount;
}